

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O2

int __thiscall QTemporaryDir::remove(QTemporaryDir *this,char *__filename)

{
  bool bVar1;
  int iVar2;
  undefined8 extraout_RAX;
  QDebug *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  char *local_38;
  QDebug local_30;
  char *local_28;
  
  local_28 = *(char **)(in_FS_OFFSET + 0x28);
  if (this->d_ptr->success == true) {
    path((QString *)&local_50,this);
    QDir::QDir((QDir *)&local_68,(QString *)&local_50);
    bVar1 = QDir::removeRecursively((QDir *)&local_68);
    QDir::~QDir((QDir *)&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    iVar2 = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
    if (bVar1) goto LAB_0023ceeb;
    local_50.d._0_4_ = 2;
    local_50.size._4_4_ = 0;
    local_50._4_8_ = 0;
    local_50._12_8_ = 0;
    local_38 = "default";
    QMessageLogger::warning((QMessageLogger *)&local_30);
    pQVar3 = QDebug::operator<<(&local_30,"QTemporaryDir: Unable to remove");
    path((QString *)&local_80,this);
    QDir::toNativeSeparators((QString *)&local_68,(QString *)&local_80);
    pQVar3 = QDebug::operator<<(pQVar3,(QString *)&local_68);
    QDebug::operator<<(pQVar3,"most likely due to the presence of read-only files.");
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QDebug::~QDebug(&local_30);
  }
  iVar2 = 0;
LAB_0023ceeb:
  if (*(char **)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QTemporaryDir::remove()
{
    if (!d_ptr->success)
        return false;
    Q_ASSERT(!path().isEmpty());
    Q_ASSERT(path() != "."_L1);

    const bool result = QDir(path()).removeRecursively();
    if (!result) {
        qWarning() << "QTemporaryDir: Unable to remove"
                   << QDir::toNativeSeparators(path())
                   << "most likely due to the presence of read-only files.";
    }
    return result;
}